

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O3

void * metro_new(t_symbol *unitname,t_floatarg f,t_floatarg tempo)

{
  t_metro *x;
  _clock *p_Var1;
  t_symbol *ptVar2;
  t_symbol *s2;
  
  x = (t_metro *)pd_new(metro_class);
  x->x_deltime = (double)(float)(~-(uint)(0.0 < f) & 0x3f800000 | (uint)f & -(uint)(0.0 < f));
  x->x_hit = 0;
  p_Var1 = clock_new(x,metro_tick);
  x->x_clock = p_Var1;
  ptVar2 = gensym("bang");
  outlet_new((t_object *)x,ptVar2);
  ptVar2 = gensym("float");
  s2 = gensym("ft1");
  inlet_new((t_object *)x,(t_pd *)x,ptVar2,s2);
  if ((tempo != 0.0) || (NAN(tempo))) {
    metro_tempo(x,unitname,tempo);
  }
  return x;
}

Assistant:

static void *metro_new(t_symbol *unitname, t_floatarg f, t_floatarg tempo)
{
    t_metro *x = (t_metro *)pd_new(metro_class);
    metro_ft1(x, f);
    x->x_hit = 0;
    x->x_clock = clock_new(x, (t_method)metro_tick);
    outlet_new(&x->x_obj, gensym("bang"));
    inlet_new(&x->x_obj, &x->x_obj.ob_pd, gensym("float"), gensym("ft1"));
    if (tempo != 0)
        metro_tempo(x, unitname, tempo);
    return (x);
}